

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kparser.cpp
# Opt level: O2

int __thiscall KParser::_if(KParser *this,int begin,BlockInfo *bi)

{
  int begin_00;
  int iVar1;
  allocator local_1a9;
  string local_1a8;
  string eLabel;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  BlockInfo local_a8;
  BlockInfo local_68;
  
  iVar1 = -1;
  if ((this->m_tokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
      super__Vector_impl_data._M_start[begin].tokenType == _if) {
    BlockInfo::BlockInfo(&local_68,bi);
    begin_00 = _expr(this,begin + 1,&local_68);
    BlockInfo::~BlockInfo(&local_68);
    if (-1 < begin_00) {
      iVar1 = this->m_labelNumber;
      this->m_labelNumber = iVar1 + 1;
      std::__cxx11::to_string(&local_1a8,iVar1);
      std::operator+(&eLabel,"LABEL",&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::string((string *)&local_c8,"jz",(allocator *)&local_1a8);
      std::__cxx11::string::string((string *)&local_e8,(string *)&eLabel);
      std::__cxx11::string::string((string *)&local_108,anon_var_dwarf_13527 + 0x22,&local_1a9);
      addCode(this,&local_c8,&local_e8,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&local_c8);
      BlockInfo::BlockInfo(&local_a8,bi);
      iVar1 = _block(this,begin_00,&local_a8);
      BlockInfo::~BlockInfo(&local_a8);
      if (iVar1 < 0) {
        iVar1 = -1;
      }
      else {
        std::__cxx11::string::string((string *)&local_128,"label",(allocator *)&local_1a8);
        std::__cxx11::string::string((string *)&local_148,(string *)&eLabel);
        std::__cxx11::string::string((string *)&local_168,anon_var_dwarf_13527 + 0x22,&local_1a9);
        addCode(this,&local_128,&local_148,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_128);
      }
      std::__cxx11::string::~string((string *)&eLabel);
    }
  }
  return iVar1;
}

Assistant:

int KParser::_if(int begin,  BlockInfo bi) {
    int i = begin;
    int t = 0;
    if( m_tokens[i].tokenType != TokenType::_if ) {
        return -1;
    }
    i++;

    if((t = _expr(i, bi)) < 0) {
        return -1;
    } else {
        i = t;
    } 
    std::string eLabel = "LABEL" + std::to_string(m_labelNumber++);

    addCode("jz", eLabel, "");
    if((t = _block(i, bi)) < 0) {
        return -1;
    } else {
        i = t;
    }
    addCode("label", eLabel, "");
    return i;
}